

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  uint uVar1;
  char local_68 [8];
  char var [64];
  int index;
  int tb_local;
  TextureType ttype_local;
  int stage_local;
  Context *ctx_local;
  
  if (tb != 0) {
    uVar1 = ctx->uniform_float4_count + ctx->uniform_int4_count + ctx->uniform_bool_count;
    get_ARB1_varname_in_buf(ctx,REG_TYPE_SAMPLER,stage,local_68,0x40);
    push_output(ctx,&ctx->globals);
    output_line(ctx,"PARAM %s_texbem = program.local[%d];",local_68,(ulong)uVar1);
    output_line(ctx,"PARAM %s_texbeml = program.local[%d];",local_68,(ulong)(uVar1 + 1));
    pop_output(ctx);
    ctx->uniform_float4_count = ctx->uniform_float4_count + 2;
  }
  return;
}

Assistant:

static void emit_ARB1_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    // this is mostly a no-op...you don't predeclare samplers in arb1.

    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        const int index = ctx->uniform_float4_count + ctx->uniform_int4_count +
                          ctx->uniform_bool_count;
        char var[64];
        get_ARB1_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof(var));
        push_output(ctx, &ctx->globals);
        output_line(ctx, "PARAM %s_texbem = program.local[%d];", var, index);
        output_line(ctx, "PARAM %s_texbeml = program.local[%d];", var, index+1);
        pop_output(ctx);
        ctx->uniform_float4_count += 2;
    } // if
}